

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ProgramStateDeleteShaderCase::executeForProgram
          (ProgramStateDeleteShaderCase *this,Program *program,ShaderAllocator *shaders)

{
  ShaderAllocator *this_00;
  deUint32 shader;
  char *__s;
  MessageBuilder *this_01;
  allocator<char> local_21d [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  MessageBuilder local_1b0;
  Shader *local_30;
  Shader *caseShader;
  TestLog *log;
  ShaderAllocator *shaders_local;
  Program *program_local;
  ProgramStateDeleteShaderCase *this_local;
  
  log = (TestLog *)shaders;
  shaders_local = (ShaderAllocator *)program;
  program_local = (Program *)this;
  caseShader = (Shader *)
               tcu::TestContext::getLog
                         ((this->super_ProgramStateCase).super_ApiCase.super_TestCase.super_TestCase
                          .super_TestNode.m_testCtx);
  local_30 = Functional::anon_unknown_0::ShaderAllocator::get
                       ((ShaderAllocator *)log,(this->super_ProgramStateCase).m_shaderType);
  tcu::TestLog::operator<<
            (&local_1b0,(TestLog *)caseShader,(BeginMessageToken *)&tcu::TestLog::Message);
  __s = glu::getShaderTypeName((this->super_ProgramStateCase).m_shaderType);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,__s,local_21d);
  std::operator+(&local_1f0,"Deleting ",&local_210);
  std::operator+(&local_1d0,&local_1f0," shader");
  this_01 = tcu::MessageBuilder::operator<<(&local_1b0,&local_1d0);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(local_21d);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  this_00 = shaders_local;
  shader = glu::Shader::getShader(local_30);
  glu::Program::detachShader((Program *)this_00,shader);
  Functional::anon_unknown_0::ShaderAllocator::deleteShader
            ((ShaderAllocator *)log,(this->super_ProgramStateCase).m_shaderType);
  return;
}

Assistant:

void executeForProgram (glu::Program& program, ShaderAllocator& shaders)
	{
		TestLog&		log			= m_testCtx.getLog();
		glu::Shader&	caseShader	= shaders.get(m_shaderType);

		log << TestLog::Message << "Deleting " + std::string(getShaderTypeName(m_shaderType)) + " shader" << TestLog::EndMessage;
		program.detachShader(caseShader.getShader());
		shaders.deleteShader(m_shaderType);
	}